

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool exrCheck(char *filename,bool reduceMemory,bool reduceTime,bool useStream,bool enableCoreCheck)

{
  undefined1 uVar1;
  size_t sVar2;
  ulong __n;
  ostream *poVar3;
  undefined7 in_register_00000009;
  vector<char,_std::allocator<char>_> data;
  ifstream instream;
  allocator_type local_249;
  vector<char,_std::allocator<char>_> local_248;
  long local_230;
  ulong local_228;
  byte abStack_210 [488];
  
  if ((int)CONCAT71(in_register_00000009,useStream) != 0) {
    std::ifstream::ifstream(&local_230,filename,_S_bin);
    if ((abStack_210[*(long *)(local_230 + -0x18)] & 5) == 0) {
      std::istream::seekg((long)&local_230,_S_beg);
      __n = std::istream::tellg();
      std::istream::seekg((long)&local_230,_S_beg);
      if (__n >> 0x3e == 0) {
        std::vector<char,_std::allocator<char>_>::vector(&local_248,__n,&local_249);
        std::istream::read((char *)&local_230,
                           (long)local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start);
        if (local_228 == __n) {
          uVar1 = Imf_3_4::checkOpenEXRFile
                            (local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start,__n,reduceMemory,reduceTime,
                             enableCoreCheck);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"internal error: failed to read file ",0x24);
          if (filename == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x106100);
          }
          else {
            sVar2 = strlen(filename);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,filename,sVar2)
            ;
          }
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
          std::ostream::put('\0');
          uVar1 = 1;
          std::ostream::flush();
        }
        if (local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (char *)0x0) {
          operator_delete(local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"internal error: bad file length ",0x20);
        poVar3 = std::ostream::_M_insert<long>((long)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," for in-memory stream",0x15);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        uVar1 = 1;
        std::ostream::flush();
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"internal error: bad file \'",0x1a);
      if (filename == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x106100);
      }
      else {
        sVar2 = strlen(filename);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,filename,sVar2);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"\' for in-memory stream",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
      std::ostream::put('\0');
      uVar1 = 1;
      std::ostream::flush();
    }
    std::ifstream::~ifstream(&local_230);
    return (bool)uVar1;
  }
  uVar1 = Imf_3_4::checkOpenEXRFile(filename,reduceMemory,reduceTime,enableCoreCheck);
  return (bool)uVar1;
}

Assistant:

bool
exrCheck (
    const char* filename,
    bool        reduceMemory,
    bool        reduceTime,
    bool        useStream,
    bool        enableCoreCheck)
{
    if (useStream)
    {
        //
        // open file as stream, check size
        //
        ifstream instream (filename, ifstream::binary);

        if (!instream)
        {
            cerr << "internal error: bad file '" << filename
                 << "' for in-memory stream" << endl;
            return true;
        }

        instream.seekg (0, instream.end);
        streampos length = instream.tellg ();
        instream.seekg (0, instream.beg);

        const uintptr_t kMaxSize = uintptr_t (-1) / 4;
        if (length < 0 || length > (streampos) kMaxSize)
        {
            cerr << "internal error: bad file length " << length
                 << " for in-memory stream" << endl;
            return true;
        }

        //
        // read into memory
        //
        vector<char> data (length);
        instream.read (data.data (), length);
        if (instream.gcount () != length)
        {
            cerr << "internal error: failed to read file " << filename << endl;
            return true;
        }
        return checkOpenEXRFile (
            data.data (), length, reduceMemory, reduceTime, enableCoreCheck);
    }
    else
    {
        return checkOpenEXRFile (
            filename, reduceMemory, reduceTime, enableCoreCheck);
    }
}